

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table-test.c++:470:5)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_test_c__:470:5)>
          *this)

{
  StringPtr *in_RCX;
  String local_28;
  
  makeDescription<unsigned_int&>(&local_28,(Debug *)"step",(char *)this->func->step,in_RCX);
  __return_storage_ptr__->file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table-test.c++"
  ;
  __return_storage_ptr__->line = 0x1d6;
  (__return_storage_ptr__->description).content.ptr = local_28.content.ptr;
  (__return_storage_ptr__->description).content.size_ = local_28.content.size_;
  (__return_storage_ptr__->description).content.disposer = local_28.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }